

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O3

ostream * Gs::operator<<(ostream *stream,Matrix<float,_10UL,_10UL> *mat)

{
  byte bVar1;
  undefined1 uVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  size_t c;
  long lVar9;
  size_t lengths [10];
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  long local_90;
  size_t asStack_88 [11];
  
  lVar9 = 0;
  pfVar7 = mat->m_;
  do {
    asStack_88[lVar9] = 0;
    lVar6 = 0;
    uVar8 = 0;
    do {
      sVar3 = Details::Length<float>((float *)((long)pfVar7 + lVar6));
      if (uVar8 <= sVar3) {
        uVar8 = sVar3;
      }
      asStack_88[lVar9] = uVar8;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x28);
    lVar9 = lVar9 + 1;
    pfVar7 = pfVar7 + 10;
  } while (lVar9 != 10);
  local_90 = 0;
  do {
    bVar1 = (local_90 != 9) << 5 | 0x5c;
    if (local_90 == 0) {
      bVar1 = 0x2f;
    }
    local_b0._0_1_ = bVar1;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_b0,1);
    lVar9 = 0;
    pfVar7 = mat->m_;
    do {
      sVar3 = asStack_88[lVar9];
      sVar4 = Details::Length<float>(pfVar7);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,((char)sVar3 - (char)sVar4) + '\x01');
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_b0,local_a8);
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      poVar5 = std::ostream::_M_insert<double>((double)*pfVar7);
      local_b0._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_b0,1);
      lVar6 = local_90;
      lVar9 = lVar9 + 1;
      pfVar7 = pfVar7 + 10;
    } while (lVar9 != 10);
    uVar2 = 0x7c;
    if (local_90 == 9) {
      uVar2 = 0x2f;
    }
    if (local_90 == 0) {
      uVar2 = 0x5c;
    }
    local_b0 = (char *)CONCAT71(local_b0._1_7_,uVar2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_b0,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_90 = lVar6 + 1;
    mat = (Matrix<float,_10UL,_10UL> *)((long)mat + 4);
  } while (local_90 != 10);
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}